

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_conjunctive.cpp
# Opt level: O0

BatchResult * __thiscall SelectJitOperator::next(SelectJitOperator *this)

{
  int *piVar1;
  uint *puVar2;
  BatchResult *pBVar3;
  int iVar4;
  undefined4 extraout_var;
  DbVector<int> *pDVar5;
  DbVector<unsigned_int> *this_00;
  bool local_159;
  uint local_e4;
  uint local_e0;
  uint32_t i_1;
  uint32_t i;
  uint32_t res;
  uint *res_sel_col;
  DbVector<unsigned_int> *res_sel;
  string local_c0;
  int *local_a0;
  int32_t *extprice;
  string local_90;
  int *local_70;
  int32_t *discount;
  allocator<char> local_51;
  string local_50;
  int *local_30;
  int32_t *tax;
  BatchResult *pBStack_20;
  uint32_t n;
  BatchResult *br;
  SelectJitOperator *this_local;
  
  br = (BatchResult *)this;
  iVar4 = (*this->next_->_vptr_BaseOperator[4])();
  pBStack_20 = (BatchResult *)CONCAT44(extraout_var,iVar4);
  this_local = (SelectJitOperator *)pBStack_20;
  if (pBStack_20 != (BatchResult *)0x0) {
    tax._4_4_ = BatchResult::getn(pBStack_20);
    pBVar3 = pBStack_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tax",&local_51);
    pDVar5 = BatchResult::getCol(pBVar3,&local_50);
    piVar1 = pDVar5->col;
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    pBVar3 = pBStack_20;
    local_30 = piVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"discount",(allocator<char> *)((long)&extprice + 7));
    pDVar5 = BatchResult::getCol(pBVar3,&local_90);
    piVar1 = pDVar5->col;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&extprice + 7));
    pBVar3 = pBStack_20;
    local_70 = piVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"extprice",(allocator<char> *)((long)&res_sel + 7));
    pDVar5 = BatchResult::getCol(pBVar3,&local_c0);
    piVar1 = pDVar5->col;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&res_sel + 7));
    local_a0 = piVar1;
    this_00 = (DbVector<unsigned_int> *)operator_new(0x10);
    DbVector<unsigned_int>::DbVector(this_00,tax._4_4_);
    puVar2 = this_00->col;
    i_1 = 0;
    if ((this->branching_ & 1U) == 0) {
      for (local_e4 = 0; local_e4 < tax._4_4_; local_e4 = local_e4 + 1) {
        puVar2[i_1] = local_e4;
        local_159 = false;
        if ((local_30[local_e4] < 0x32) && (local_159 = false, local_70[local_e4] < 0x32)) {
          local_159 = local_a0[local_e4] < 0x32;
        }
        i_1 = local_159 + i_1;
      }
    }
    else {
      for (local_e0 = 0; local_e0 < tax._4_4_; local_e0 = local_e0 + 1) {
        if (((local_30[local_e0] < 0x32) && (local_70[local_e0] < 0x32)) &&
           (local_a0[local_e0] < 0x32)) {
          puVar2[i_1] = local_e0;
          i_1 = i_1 + 1;
        }
      }
    }
    this_00->n = i_1;
    pBStack_20->res_sel = this_00;
    this_local = (SelectJitOperator *)pBStack_20;
  }
  return (BatchResult *)this_local;
}

Assistant:

BatchResult* next() {
        BatchResult *br = next_->next();
        if (br == nullptr)
            return br;

        uint32_t n = br->getn();
        int32_t *tax = br->getCol("tax")->col;
        int32_t *discount = br->getCol("discount")->col;
        int32_t *extprice = br->getCol("extprice")->col;

        DbVector<uint32_t> *res_sel = new DbVector<uint32_t>(n);
        auto res_sel_col = res_sel->col;
        uint32_t res = 0;
        if (branching_) {
            for (uint32_t i = 0; i < n; i++) {
                if (tax[i] < 50 && discount[i] < 50 && extprice[i] < 50)
                    res_sel_col[res++] = i;
            }
        }
        else {
            for (uint32_t i = 0; i < n; i++) {
                res_sel_col[res] = i;
                res += (tax[i] < 50 && discount[i] < 50 && extprice[i] < 50);
            }
        }
        res_sel->n = res;
        br->res_sel = res_sel;

        // std::cout << "n=" << res_sel->n << ", capacity=" << res_sel->capacity << ", col=" << (uint64_t)res_sel->col << "\n";
        return br;
    }